

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort_seq.hpp
# Opt level: O1

void burst::
     radix_sort<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,burst::to_ordered_integral_fn,burst::low_byte_fn>
               (move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                first,move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      last,
               __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
               buffer)

{
  __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_> _Var1;
  anon_class_16_2_d94e93d1 map;
  anon_class_16_2_d94e93d1 map_00;
  low_byte_fn local_16;
  low_byte_fn local_15;
  compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> local_14;
  compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> local_12;
  
  if ((long)last._M_current._M_current - (long)first._M_current._M_current < 0x80000000) {
    map_00.radix = &local_16;
    map_00.map = &local_14;
    _Var1 = detail::
            counting_sort_impl<int,std::move_iterator<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,burst::detail::radix_sort_impl<int,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn>(__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn)::_lambda(auto:1_const&)_1_>
                      (first,last,buffer,map_00);
  }
  else {
    map.radix = &local_15;
    map.map = &local_12;
    _Var1 = detail::
            counting_sort_impl<long,std::move_iterator<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,burst::detail::radix_sort_impl<long,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn>(__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn)::_lambda(auto:1_const&)_1_>
                      (first,last,buffer,map);
  }
  if ((long)_Var1._M_current - (long)buffer._M_current != 0) {
    memmove((void *)first._M_current._M_current,buffer._M_current,
            (long)_Var1._M_current - (long)buffer._M_current);
  }
  return;
}

Assistant:

void
        radix_sort
        (
            RandomAccessIterator1 first,
            RandomAccessIterator1 last,
            RandomAccessIterator2 buffer,
            Map map,
            Radix radix
        )
    {
        using difference_type = iterator_difference_t<RandomAccessIterator1>;
        using min_type =
            typename std::conditional
            <
                sizeof(std::int32_t) < sizeof(difference_type),
                std::int32_t,
                difference_type
            >
            ::type;

        using std::distance;
        if (distance(first, last) <= std::numeric_limits<min_type>::max())
        {
            detail::radix_sort_impl<min_type>
            (
                first,
                last,
                buffer,
                compose(shift_to_unsigned, std::move(map)),
                radix
            );
        }
        else
        {
            detail::radix_sort_impl<difference_type>
            (
                first,
                last,
                buffer,
                compose(shift_to_unsigned, std::move(map)),
                radix
            );
        }
    }